

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_system.cpp
# Opt level: O0

void I_Error(char *error,...)

{
  CRecoverableError *this;
  char local_428 [8];
  char errortext [1024];
  va_list argptr;
  char *error_local;
  
  errortext[0x3fc] = '0';
  errortext[0x3fd] = '\0';
  errortext[0x3fe] = '\0';
  errortext[0x3ff] = '\0';
  errortext[0x3f8] = '\b';
  errortext[0x3f9] = '\0';
  errortext[0x3fa] = '\0';
  errortext[0x3fb] = '\0';
  vsprintf(local_428,error,errortext + 0x3f8);
  this = (CRecoverableError *)__cxa_allocate_exception(0x400);
  CRecoverableError::CRecoverableError(this,local_428);
  __cxa_throw(this,&CRecoverableError::typeinfo,0);
}

Assistant:

void I_Error (const char *error, ...)
{
    va_list argptr;
    char errortext[MAX_ERRORTEXT];

    va_start (argptr, error);
    vsprintf (errortext, error, argptr);
    va_end (argptr);

    throw CRecoverableError (errortext);
}